

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spot_light.cpp
# Opt level: O1

Light_SampleRes *
embree::SpotLight_sample
          (Light_SampleRes *__return_storage_ptr__,Light *super,DifferentialGeometry *dg,Vec2f *s)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  float fVar15;
  float fVar16;
  float fVar17;
  
  fVar5 = (float)super[4].type - (dg->P).field_0.m128[0];
  fVar11 = (float)super[5].type - (dg->P).field_0.m128[1];
  fVar12 = (float)super[6].type - (dg->P).field_0.m128[2];
  fVar13 = (float)super[7].type - (dg->P).field_0.m128[3];
  (__return_storage_ptr__->dir).field_0.m128[0] = fVar5;
  (__return_storage_ptr__->dir).field_0.m128[1] = fVar11;
  (__return_storage_ptr__->dir).field_0.m128[2] = fVar12;
  (__return_storage_ptr__->dir).field_0.m128[3] = fVar13;
  fVar15 = (float)super[0x1a].type;
  if (0.0 < fVar15) {
    fVar6 = (s->field_0).field_0.x;
    if (fVar6 < 0.0) {
      fVar6 = sqrtf(fVar6);
    }
    else {
      fVar6 = SQRT(fVar6);
    }
    fVar15 = fVar15 * fVar6;
    fVar6 = (s->field_0).field_0.y * 6.2831855;
    fVar7 = sinf(fVar6);
    fVar8 = cosf(fVar6);
    fVar8 = fVar8 * fVar15;
    fVar7 = fVar7 * fVar15;
    fVar15 = (float)super[0x11].type;
    fVar6 = (float)super[0x12].type;
    fVar14 = (float)super[0x13].type;
    fVar16 = (float)super[0xd].type;
    fVar17 = (float)super[0xe].type;
    fVar1 = (float)super[0xf].type;
    fVar2 = (float)super[9].type;
    fVar3 = (float)super[10].type;
    fVar4 = (float)super[0xb].type;
    (__return_storage_ptr__->dir).field_0.m128[0] =
         fVar5 + fVar8 * (float)super[8].type +
                 fVar7 * (float)super[0xc].type + (float)super[0x10].type * 0.0;
    (__return_storage_ptr__->dir).field_0.m128[1] =
         fVar11 + fVar8 * fVar2 + fVar7 * fVar16 + fVar15 * 0.0;
    (__return_storage_ptr__->dir).field_0.m128[2] =
         fVar12 + fVar8 * fVar3 + fVar7 * fVar17 + fVar6 * 0.0;
    (__return_storage_ptr__->dir).field_0.m128[3] =
         fVar13 + fVar8 * fVar4 + fVar7 * fVar1 + fVar14 * 0.0;
  }
  fVar15 = (__return_storage_ptr__->dir).field_0.m128[0];
  fVar5 = (__return_storage_ptr__->dir).field_0.m128[1];
  fVar11 = (__return_storage_ptr__->dir).field_0.m128[2];
  fVar12 = (__return_storage_ptr__->dir).field_0.m128[3];
  fVar13 = fVar5 * fVar5;
  fVar6 = fVar11 * fVar11;
  fVar14 = fVar12 * fVar12;
  fVar16 = fVar13 + fVar15 * fVar15 + fVar6;
  fVar17 = fVar13 + fVar13 + fVar14;
  fVar6 = fVar13 + fVar6 + fVar6;
  fVar14 = fVar13 + fVar14 + fVar14;
  auVar9._4_4_ = fVar17;
  auVar9._0_4_ = fVar16;
  auVar9._8_4_ = fVar6;
  auVar9._12_4_ = fVar14;
  auVar10._4_4_ = fVar17;
  auVar10._0_4_ = fVar16;
  auVar10._8_4_ = fVar6;
  auVar10._12_4_ = fVar14;
  auVar10 = rsqrtss(auVar9,auVar10);
  fVar13 = auVar10._0_4_;
  fVar13 = fVar13 * fVar13 * fVar16 * -0.5 * fVar13 + fVar13 * 1.5;
  (__return_storage_ptr__->dir).field_0.m128[0] = fVar13 * fVar15;
  (__return_storage_ptr__->dir).field_0.m128[1] = fVar13 * fVar5;
  (__return_storage_ptr__->dir).field_0.m128[2] = fVar13 * fVar11;
  (__return_storage_ptr__->dir).field_0.m128[3] = fVar13 * fVar12;
  __return_storage_ptr__->dist = fVar16 * fVar13;
  fVar11 = fVar13 * fVar11 * (float)super[0x12].type +
           fVar13 * fVar5 * (float)super[0x11].type + fVar13 * fVar15 * (float)super[0x10].type;
  fVar15 = (float)super[0x18].type;
  fVar5 = (float)super[0x19].type;
  if ((float)super[0x1a].type <= 0.0) {
    fVar12 = INFINITY;
  }
  else {
    fVar12 = ABS(fVar11) * fVar16 * (float)super[0x1b].type;
  }
  __return_storage_ptr__->pdf = fVar12;
  fVar5 = fVar5 * (-fVar11 - fVar15);
  if (1.0 <= fVar5) {
    fVar5 = 1.0;
  }
  fVar15 = 0.0;
  if (0.0 <= fVar5) {
    fVar15 = fVar5;
  }
  fVar15 = fVar13 * fVar13 * fVar15;
  fVar5 = (float)super[0x15].type;
  fVar11 = (float)super[0x16].type;
  fVar12 = (float)super[0x17].type;
  (__return_storage_ptr__->weight).field_0.m128[0] = fVar15 * (float)super[0x14].type;
  (__return_storage_ptr__->weight).field_0.m128[1] = fVar15 * fVar5;
  (__return_storage_ptr__->weight).field_0.m128[2] = fVar15 * fVar11;
  (__return_storage_ptr__->weight).field_0.m128[3] = fVar15 * fVar12;
  return __return_storage_ptr__;
}

Assistant:

SYCL_EXTERNAL Light_SampleRes SpotLight_sample(const Light* super,
                                                              const DifferentialGeometry& dg,
                                                              const Vec2f& s)
{
  const SpotLight* self = (SpotLight*)super;
  Light_SampleRes res;

  // extant light vector from the hit point
  res.dir = self->position - dg.P;

  if (self->radius > 0.0f)
    res.dir = self->frame * uniformSampleDisk(self->radius, s) + res.dir;

  const float dist2 = dot(res.dir, res.dir);
  const float invdist = rsqrt(dist2);

  // normalized light vector
  res.dir = res.dir * invdist;
  res.dist = dist2 * invdist;

  // cosine of the negated light direction and light vector.
  const float cosAngle = -dot(self->frame.vz, res.dir);
  const float angularAttenuation = clamp((cosAngle - self->cosAngleMax) * self->cosAngleScale);

  if (self->radius > 0.0f)
    res.pdf = self->diskPdf * dist2 * abs(cosAngle);
  else
    res.pdf = inf; // we always take this res

  // convert from power to radiance by attenuating by distance^2; attenuate by angle
  res.weight = self->power * (sqr(invdist) * angularAttenuation);

  return res;
}